

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O3

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::compoundStmt(Parser *this)

{
  long lVar1;
  undefined8 uVar2;
  Token TVar3;
  CompoundStmt *this_00;
  pointer *__ptr;
  long in_RSI;
  Lexer *this_01;
  SourceLocation sloc;
  _Head_base<0UL,_flow::lang::Symbol_*,_false> local_78;
  Symbol *local_70;
  _Base_ptr *local_68;
  _Base_ptr local_60;
  _Base_ptr local_58 [2];
  size_t local_48;
  __uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_> _Stack_40;
  SymbolTable *local_38;
  
  lVar1 = *(long *)(in_RSI + 0x30);
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,*(long *)(lVar1 + 0x68),
             *(long *)(lVar1 + 0x70) + *(long *)(lVar1 + 0x68));
  local_38 = *(SymbolTable **)(lVar1 + 0x98);
  local_48 = *(size_t *)(lVar1 + 0x88);
  _Stack_40._M_t.
  super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
  super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl =
       ((__uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_> *)
       (lVar1 + 0x90))->_M_t;
  Lexer::nextToken(*(Lexer **)(in_RSI + 0x30));
  this_00 = (CompoundStmt *)operator_new(0x60);
  (this_00->super_Stmt).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_001ae890;
  (this_00->super_Stmt).super_ASTNode.location_.filename._M_dataplus._M_p =
       (pointer)&(this_00->super_Stmt).super_ASTNode.location_.filename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this_00->super_Stmt).super_ASTNode.location_,local_68,
             (long)&local_60->_M_color + (long)local_68);
  *(SymbolTable **)&(this_00->super_Stmt).super_ASTNode.location_.end.column = local_38;
  (this_00->super_Stmt).super_ASTNode.location_.begin.line = (undefined4)local_48;
  (this_00->super_Stmt).super_ASTNode.location_.begin.column = local_48._4_4_;
  *(tuple<flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_> *)
   &(this_00->super_Stmt).super_ASTNode.location_.begin.offset =
       _Stack_40._M_t.
       super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
       super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  (this_00->super_Stmt).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__CompoundStmt_001aedd0;
  (this_00->scope_)._M_t.
  super___uniq_ptr_impl<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_>._M_t
  .super__Tuple_impl<0UL,_flow::lang::SymbolTable_*,_std::default_delete<flow::lang::SymbolTable>_>.
  super__Head_base<0UL,_flow::lang::SymbolTable_*,_false>._M_head_impl = (SymbolTable *)0x0;
  (this_00->statements_).
  super__List_base<std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>,_std::allocator<std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this_00->statements_;
  (this_00->statements_).
  super__List_base<std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>,_std::allocator<std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this_00->statements_;
  (this_00->statements_).
  super__List_base<std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>,_std::allocator<std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this_01 = *(Lexer **)(in_RSI + 0x30);
  TVar3 = this_01->token_;
  if (TVar3 == Var) {
    do {
      varDecl((Parser *)&local_70);
      if (local_70 == (Symbol *)0x0) goto LAB_0012e0ec;
      local_78._M_head_impl = local_70;
      SymbolTable::appendSymbol
                (*(SymbolTable **)(in_RSI + 0x38),
                 (unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_> *)
                 &local_78);
      if (local_78._M_head_impl != (Symbol *)0x0) {
        (*((local_78._M_head_impl)->super_ASTNode)._vptr_ASTNode[1])();
      }
      local_78._M_head_impl = (Symbol *)0x0;
      this_01 = *(Lexer **)(in_RSI + 0x30);
      TVar3 = this_01->token_;
    } while (TVar3 == Var);
  }
  if (TVar3 != End) {
    do {
      stmt((Parser *)&local_70);
      if (local_70 == (Symbol *)0x0) goto LAB_0012e0ec;
      CompoundStmt::push_back
                (this_00,(unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)
                         &local_70);
      if (local_70 != (Symbol *)0x0) {
        (*(local_70->super_ASTNode)._vptr_ASTNode[1])();
      }
      this_01 = *(Lexer **)(in_RSI + 0x30);
    } while (this_01->token_ != End);
  }
  Lexer::nextToken(this_01);
  lVar1 = *(long *)(in_RSI + 0x30);
  (this_00->super_Stmt).super_ASTNode.location_.end.offset = *(uint *)(lVar1 + 100);
  uVar2 = *(undefined8 *)(lVar1 + 0x5c);
  (this_00->super_Stmt).super_ASTNode.location_.end.line = (int)uVar2;
  (this_00->super_Stmt).super_ASTNode.location_.end.column = (int)((ulong)uVar2 >> 0x20);
  *(CompoundStmt **)&(this->features_)._M_t._M_impl = this_00;
LAB_0012e0fc:
  if (local_68 != local_58) {
    operator_delete(local_68,(ulong)((long)&local_58[0]->_M_color + 1));
  }
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
LAB_0012e0ec:
  *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
  (*(this_00->super_Stmt).super_ASTNode._vptr_ASTNode[1])(this_00);
  goto LAB_0012e0fc;
}

Assistant:

std::unique_ptr<Stmt> Parser::compoundStmt() {
  SourceLocation sloc(location());
  nextToken();  // '{'

  std::unique_ptr<CompoundStmt> cs = std::make_unique<CompoundStmt>(sloc);

  while (token() == Token::Var) {
    if (std::unique_ptr<VariableSym> var = varDecl())
      currentScope()->appendSymbol(std::move(var));
    else
      return nullptr;
  }

  for (;;) {
    if (consumeIf(Token::End)) {
      cs->location().update(end());
      return std::unique_ptr<Stmt>(cs.release());
    }

    if (std::unique_ptr<Stmt> s = stmt())
      cs->push_back(std::move(s));
    else
      return nullptr;
  }
}